

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmTrimWhitespace_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  const_iterator pvVar1;
  bool bVar2;
  const_iterator pvVar3;
  char *__end;
  bool local_59;
  allocator<char> local_31;
  char *local_30;
  const_iterator stop;
  const_iterator start;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  start = (const_iterator)str._M_len;
  str_local._M_str = (char *)__return_storage_ptr__;
  stop = std::basic_string_view<char,_std::char_traits<char>_>::begin
                   ((basic_string_view<char,_std::char_traits<char>_> *)&start);
  while( true ) {
    pvVar1 = stop;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&start);
    local_59 = false;
    if (pvVar1 != pvVar3) {
      local_59 = cmIsSpace(*stop);
    }
    pvVar1 = stop;
    if (local_59 == false) break;
    stop = stop + 1;
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&start);
  if (pvVar1 == pvVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_30 = std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)&start);
    do {
      local_30 = local_30 + -1;
      bVar2 = cmIsSpace(*local_30);
      pvVar1 = stop;
    } while (bVar2);
    __end = local_30 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,pvVar1,__end,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTrimWhitespace(cm::string_view str)
{
  // XXX(clang-tidy): This declaration and the next cannot be `const auto*`
  // because the qualification of `auto` is platform-dependent.
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto start = str.begin();
  while (start != str.end() && cmIsSpace(*start)) {
    ++start;
  }
  if (start == str.end()) {
    return std::string();
  }
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto stop = str.end() - 1;
  while (cmIsSpace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}